

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O2

void __thiscall w3Module::read_memory(w3Module *this,uint8_t **cursor)

{
  uint32_t uVar1;
  ulong uVar2;
  bool bVar3;
  w3Limits wVar4;
  string local_40;
  
  puts("reading section5");
  uVar1 = read_varuint32(this,cursor);
  uVar2 = (ulong)uVar1;
  if (1 < uVar1) {
    StringFormat_abi_cxx11_(&local_40,"%lX",uVar2);
    AssertFailedFormat("size <= 1",&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    wVar4 = read_limits(this,cursor);
    (this->memory_limits).min = (int)wVar4._0_8_;
    (this->memory_limits).max = (int)((ulong)wVar4._0_8_ >> 0x20);
    (this->memory_limits).hasMax = wVar4.hasMax;
  }
  printf("read section5 min:%X hasMax:%X max:%X\n",(ulong)(this->memory_limits).min,
         (ulong)(this->memory_limits).hasMax,(ulong)(this->memory_limits).max);
  return;
}

Assistant:

void w3Module::read_memory (uint8_t** cursor)
{
    printf ("reading section5\n");
    const size_t size = read_varuint32 (cursor);
    AssertFormat (size <= 1, ("%" FORMAT_SIZE "X", size)); // FUTURE
    for (size_t i = 0; i < size; ++i)
        memory_limits = read_limits (cursor);
    printf ("read section5 min:%X hasMax:%X max:%X\n", memory_limits.min, memory_limits.hasMax, memory_limits.max);
}